

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsVarSerializerReleaseData(JsVarSerializerHandle serializerHandle,byte **data,size_t *dataLength)

{
  anon_class_24_3_8504a8c7 fn;
  size_t *local_28;
  size_t *dataLength_local;
  byte **data_local;
  JsVarSerializerHandle serializerHandle_local;
  
  if (serializerHandle == (JsVarSerializerHandle)0x0) {
    serializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else if (data == (byte **)0x0) {
    serializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else if (dataLength == (size_t *)0x0) {
    serializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else {
    fn.data = (byte ***)&dataLength_local;
    fn.serializerHandle = &data_local;
    fn.dataLength = &local_28;
    local_28 = dataLength;
    dataLength_local = (size_t *)data;
    data_local = (byte **)serializerHandle;
    serializerHandle_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsVarSerializerReleaseData::__0>(fn,false,false);
  }
  return serializerHandle_local._4_4_;
}

Assistant:

CHAKRA_API
JsVarSerializerReleaseData(
    _In_ JsVarSerializerHandle serializerHandle,
    _Out_ byte** data,
    _Out_ size_t *dataLength)
{
    PARAM_NOT_NULL(serializerHandle);
    PARAM_NOT_NULL(data);
    PARAM_NOT_NULL(dataLength);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraCoreStreamWriter* streamWriter = reinterpret_cast<ChakraCoreStreamWriter*>(serializerHandle);
        if (!streamWriter->ReleaseData(data, dataLength))
        {
            return JsErrorInvalidArgument;
        }
        return JsNoError;
    });
}